

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int prepare_stream_state_sender
              (quicly_stream_t *stream,quicly_sender_state_t *sender,quicly_send_context_t *s,
              size_t min_space,quicly_sent_acked_cb ack_cb)

{
  quicly_conn_t *in_RCX;
  undefined4 *in_RSI;
  long in_RDI;
  quicly_send_context_t *in_R8;
  int ret;
  quicly_sent_t *sent;
  quicly_sent_acked_cb in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  size_t in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  local_4 = allocate_ack_eliciting_frame
                      (in_RCX,in_R8,in_stack_ffffffffffffffc8,
                       (quicly_sent_t **)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
  if (local_4 == 0) {
    *(undefined8 *)(in_stack_ffffffffffffffc8 + 8) = *(undefined8 *)(in_RDI + 8);
    *in_RSI = 2;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int prepare_stream_state_sender(quicly_stream_t *stream, quicly_sender_state_t *sender, quicly_send_context_t *s,
                                       size_t min_space, quicly_sent_acked_cb ack_cb)
{
    quicly_sent_t *sent;
    int ret;

    if ((ret = allocate_ack_eliciting_frame(stream->conn, s, min_space, &sent, ack_cb)) != 0)
        return ret;
    sent->data.stream_state_sender.stream_id = stream->stream_id;
    *sender = QUICLY_SENDER_STATE_UNACKED;

    return 0;
}